

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

ScenarioLowerBound * __thiscall
despot::Adventurer::CreateScenarioLowerBound
          (Adventurer *this,string *name,string *particle_bound_name)

{
  StatePolicy *pSVar1;
  StatePolicy *pSVar2;
  StateIndexer *pSVar3;
  bool bVar4;
  Adventurer *pAVar5;
  ParticleLowerBound *pPVar6;
  ostream *poVar7;
  string local_160 [39];
  allocator<char> local_139;
  string local_138;
  undefined1 local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c1;
  string local_c0 [39];
  undefined1 local_99;
  string local_98 [39];
  undefined1 local_71;
  string local_70 [48];
  StatePolicy *local_40;
  StatePolicy *policy;
  StateIndexer *indexer;
  DSPOMDP *model;
  string *particle_bound_name_local;
  string *name_local;
  Adventurer *this_local;
  
  policy = (StatePolicy *)&this->super_StateIndexer;
  local_40 = &this->super_StatePolicy;
  indexer = (StateIndexer *)this;
  model = (DSPOMDP *)particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  bVar4 = std::operator==(name,"TRIVIAL");
  if (bVar4) {
    pAVar5 = (Adventurer *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)pAVar5,(DSPOMDP *)indexer);
    this_local = pAVar5;
  }
  else {
    bVar4 = std::operator==(name,"STAY");
    if ((!bVar4) && (bVar4 = std::operator==(name,"DEFAULT"), !bVar4)) {
      bVar4 = std::operator==(name,"SMART");
      if (bVar4) {
        pAVar5 = (Adventurer *)operator_new(0x28);
        pSVar3 = indexer;
        local_99 = 1;
        std::__cxx11::string::string(local_98,(string *)particle_bound_name);
        pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_98);
        AdventurerSmartPolicy::AdventurerSmartPolicy
                  ((AdventurerSmartPolicy *)pAVar5,(DSPOMDP *)pSVar3,pPVar6);
        local_99 = 0;
        this_local = pAVar5;
        std::__cxx11::string::~string(local_98);
        return (ScenarioLowerBound *)this_local;
      }
      bVar4 = std::operator==(name,"RANDOM");
      if (bVar4) {
        pAVar5 = (Adventurer *)operator_new(0x38);
        pSVar3 = indexer;
        local_c1 = 1;
        std::__cxx11::string::string(local_c0,(string *)particle_bound_name);
        pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_c0);
        despot::RandomPolicy::RandomPolicy((RandomPolicy *)pAVar5,(DSPOMDP *)pSVar3,pPVar6);
        local_c1 = 0;
        this_local = pAVar5;
        std::__cxx11::string::~string(local_c0);
        return (ScenarioLowerBound *)this_local;
      }
      bVar4 = std::operator==(name,"MODE");
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"MDP",&local_e9);
        ComputeDefaultActions(this,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        pAVar5 = (Adventurer *)operator_new(0x48);
        pSVar3 = indexer;
        pSVar2 = policy;
        pSVar1 = local_40;
        local_111 = 1;
        std::__cxx11::string::string(local_110,(string *)particle_bound_name);
        pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_110);
        despot::ModeStatePolicy::ModeStatePolicy
                  ((ModeStatePolicy *)pAVar5,(DSPOMDP *)pSVar3,(StateIndexer *)pSVar2,pSVar1,pPVar6)
        ;
        local_111 = 0;
        this_local = pAVar5;
        std::__cxx11::string::~string(local_110);
        return (ScenarioLowerBound *)this_local;
      }
      bVar4 = std::operator==(name,"MAJORITY");
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"MDP",&local_139);
        ComputeDefaultActions(this,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        pAVar5 = (Adventurer *)operator_new(0x28);
        pSVar3 = indexer;
        pSVar1 = local_40;
        std::__cxx11::string::string(local_160,(string *)particle_bound_name);
        pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_160);
        despot::MajorityActionPolicy::MajorityActionPolicy
                  ((MajorityActionPolicy *)pAVar5,(DSPOMDP *)pSVar3,pSVar1,pPVar6);
        this_local = pAVar5;
        std::__cxx11::string::~string(local_160);
        return (ScenarioLowerBound *)this_local;
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario lower bound: ");
      poVar7 = std::operator<<(poVar7,(string *)name);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    pAVar5 = (Adventurer *)operator_new(0x28);
    pSVar3 = indexer;
    local_71 = 1;
    std::__cxx11::string::string(local_70,(string *)particle_bound_name);
    pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_70);
    despot::BlindPolicy::BlindPolicy((BlindPolicy *)pAVar5,(DSPOMDP *)pSVar3,0,pPVar6);
    local_71 = 0;
    this_local = pAVar5;
    std::__cxx11::string::~string(local_70);
  }
  return (ScenarioLowerBound *)this_local;
}

Assistant:

ScenarioLowerBound* Adventurer::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "STAY" || name == "DEFAULT") {
		return new BlindPolicy(model, A_STAY,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "SMART") {
		return new AdventurerSmartPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE") {
		const_cast<Adventurer*>(this)->ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY") {
		// ComputeDefaultActions(Globals::config.default_action);
		const_cast<Adventurer*>(this)->ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario lower bound: " << name << endl;
		exit(-1);
		return NULL;
	}
}